

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Random *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference ppEVar4;
  uint32_t index;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec_local;
  Random *this_local;
  
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty(vec);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!vec.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                  ,0x50,
                  "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Expression *>]"
                 );
  }
  sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(vec);
  uVar2 = upTo(this,(uint32_t)sVar3);
  ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                      (vec,(ulong)uVar2);
  return ppEVar4;
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }